

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SWDSimulationDataGenerator.cpp
# Opt level: O3

void __thiscall
SWDSimulationDataGenerator::Initialize
          (SWDSimulationDataGenerator *this,U32 simulation_sample_rate,SWDAnalyzerSettings *settings
          )

{
  SimulationChannelDescriptor *pSVar1;
  
  this->mSimulationSampleRateHz = simulation_sample_rate;
  this->mSettings = settings;
  ClockGenerator::Init((double)(simulation_sample_rate / 10),(int)this + 0x10);
  pSVar1 = (SimulationChannelDescriptor *)
           SimulationChannelDescriptorGroup::Add
                     ((Channel *)&this->mSWDSimulationChannels,(int)settings + 0x10,
                      this->mSimulationSampleRateHz);
  this->mSWDIO = pSVar1;
  pSVar1 = (SimulationChannelDescriptor *)
           SimulationChannelDescriptorGroup::Add
                     ((Channel *)&this->mSWDSimulationChannels,(int)settings + 0x20,
                      this->mSimulationSampleRateHz);
  this->mSWCLK = pSVar1;
  this->mSimulCnt = 0x115e;
  return;
}

Assistant:

void SWDSimulationDataGenerator::Initialize( U32 simulation_sample_rate, SWDAnalyzerSettings* settings )
{
    mSimulationSampleRateHz = simulation_sample_rate;
    mSettings = settings;

    mClockGenerator.Init( simulation_sample_rate / 10, simulation_sample_rate );

    mSWDIO = mSWDSimulationChannels.Add( settings->mSWDIO, mSimulationSampleRateHz, BIT_LOW );
    mSWCLK = mSWDSimulationChannels.Add( settings->mSWCLK, mSimulationSampleRateHz, BIT_LOW );

    // start from the end to force a line reset in GenerateSimulationData
    mSimulCnt = sizeof( simul_data ) / sizeof( SimulationData ) - 1;
}